

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O2

void __thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
GenericValue(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *this,int64_t i64)

{
  ushort uVar1;
  
  (this->data_).s.str = (Ch *)0x0;
  *(undefined8 *)((long)&this->data_ + 0x10) = 0;
  (this->data_).n = (Number)i64;
  (this->data_).f.flags = 0x96;
  if (i64 < 0) {
    uVar1 = 0xb6;
    if ((ulong)i64 < 0xffffffff80000000) {
      return;
    }
  }
  else {
    uVar1 = 0x1f6;
    if ((i64 & 0xffffffff80000000U) != 0) {
      uVar1 = (ushort)((ulong)i64 >> 0x20 == 0) << 6 | 0x196;
    }
  }
  (this->data_).f.flags = uVar1;
  return;
}

Assistant:

explicit GenericValue(int64_t i64) RAPIDJSON_NOEXCEPT : data_() {
        data_.n.i64 = i64;
        data_.f.flags = kNumberInt64Flag;
        if (i64 >= 0) {
            data_.f.flags |= kNumberUint64Flag;
            if (!(static_cast<uint64_t>(i64) & RAPIDJSON_UINT64_C2(0xFFFFFFFF, 0x00000000)))
                data_.f.flags |= kUintFlag;
            if (!(static_cast<uint64_t>(i64) & RAPIDJSON_UINT64_C2(0xFFFFFFFF, 0x80000000)))
                data_.f.flags |= kIntFlag;
        }
        else if (i64 >= static_cast<int64_t>(RAPIDJSON_UINT64_C2(0xFFFFFFFF, 0x80000000)))
            data_.f.flags |= kIntFlag;
    }